

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O0

QTlsBackend * QTlsBackend::findBackend(QString *backendName)

{
  long lVar1;
  bool bVar2;
  Type *pTVar3;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QTlsBackend *fct;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff98;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_stack_ffffffffffffffa0;
  QDebug *in_stack_ffffffffffffffb8;
  QString *t;
  QString *in_stack_ffffffffffffffc8;
  BackendCollection *in_stack_ffffffffffffffd0;
  QDebug local_20;
  char *t_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar3 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_backends>_>::operator()
                     ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_backends>_>
                       *)in_stack_ffffffffffffff98);
  if (pTVar3 == (Type *)0x0) {
    t = (QString *)0x0;
  }
  else {
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_backends>_>::operator->
              ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_backends>_> *)
               0x2784a7);
    t = (QString *)
        anon_unknown.dwarf_4f207b::BackendCollection::backend
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (t == (QString *)0x0) {
      t_00 = (char *)0xaaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcSsl();
      anon_unknown.dwarf_4f207b::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&stack0xffffffffffffffe8), bVar2) {
        anon_unknown.dwarf_4f207b::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x278514);
        QMessageLogger::QMessageLogger
                  (in_RDI,(char *)t,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                   (char *)in_stack_ffffffffffffff98,(char *)0x27852a);
        QMessageLogger::warning();
        QDebug::operator<<(in_stack_ffffffffffffffb8,t_00);
        QDebug::operator<<((QDebug *)in_RDI,t);
        QDebug::~QDebug(&local_20);
      }
      t = (QString *)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QTlsBackend *)t;
}

Assistant:

QTlsBackend *QTlsBackend::findBackend(const QString &backendName)
{
    if (!backends())
        return {};

    if (auto *fct = backends->backend(backendName))
        return fct;

    qCWarning(lcSsl) << "Cannot create unknown backend named" << backendName;
    return nullptr;
}